

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O2

void __thiscall SBarInfo::ParseMugShotBlock(SBarInfo *this,FScanner *sc,FMugShotState *state)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  char *__s;
  FString local_50;
  FMugShotFrame frame;
  
  FScanner::MustGetToken(sc,0x7b);
  do {
    bVar1 = FScanner::CheckToken(sc,0x7d);
    if (bVar1) {
      return;
    }
    FMugShotFrame::FMugShotFrame(&frame);
    bVar1 = FScanner::CheckToken(sc,0x7b);
    do {
      FScanner::MustGetToken(sc,0x101);
      __s = sc->String;
      sVar3 = strlen(__s);
      if (5 < sVar3) {
        FScanner::ScriptError(sc,"MugShot frames cannot exceed 5 characters.");
        __s = sc->String;
      }
      FString::FString(&local_50,__s);
      TArray<FString,_FString>::Push(&frame.Graphic,&local_50);
      FString::~FString(&local_50);
      if (!bVar1) goto LAB_0056da5f;
      bVar2 = FScanner::CheckToken(sc,0x2c);
    } while (bVar2);
    FScanner::MustGetToken(sc,0x7d);
LAB_0056da5f:
    bVar1 = FScanner::CheckToken(sc,0x2d);
    FScanner::MustGetToken(sc,0x104);
    frame.Delay = -sc->Number;
    if (!bVar1) {
      frame.Delay = sc->Number;
    }
    FScanner::MustGetToken(sc,0x3b);
    TArray<FMugShotFrame,_FMugShotFrame>::Push(&state->Frames,&frame);
    FMugShotFrame::~FMugShotFrame(&frame);
  } while( true );
}

Assistant:

void SBarInfo::ParseMugShotBlock(FScanner &sc, FMugShotState &state)
{
	sc.MustGetToken('{');
	while(!sc.CheckToken('}'))
	{
		FMugShotFrame frame;
		bool multiframe = false;
		if(sc.CheckToken('{'))
			multiframe = true;
		do
		{
			sc.MustGetToken(TK_Identifier);
			if(strlen(sc.String) > 5)
				sc.ScriptError("MugShot frames cannot exceed 5 characters.");
			frame.Graphic.Push(sc.String);
		}
		while(multiframe && sc.CheckToken(','));
		if(multiframe)
			sc.MustGetToken('}');
		bool negative = sc.CheckToken('-');
		sc.MustGetToken(TK_IntConst);
		frame.Delay = (negative ? -1 : 1)*sc.Number;
		sc.MustGetToken(';');
		state.Frames.Push(frame);
	}
}